

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.h
# Opt level: O0

void __thiscall
VW::vw_argument_disagreement_exception::vw_argument_disagreement_exception
          (vw_argument_disagreement_exception *this,char *file,int lineNumber,string *message)

{
  string *in_RCX;
  undefined8 *in_RDI;
  string *pmessage;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  vw_exception *in_stack_ffffffffffffffc0;
  
  pmessage = (string *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string((string *)pmessage,in_RCX);
  vw_exception::vw_exception
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,pmessage)
  ;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  *in_RDI = &PTR__vw_argument_disagreement_exception_00474800;
  return;
}

Assistant:

vw_argument_disagreement_exception(const char* file, int lineNumber, std::string message)
      : vw_exception(file, lineNumber, message)
  {
  }